

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

size_t __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateParseAuxTable
          (MessageGenerator *this,Printer *printer)

{
  int iVar1;
  FieldDescriptor *descriptor;
  bool bVar2;
  Type TVar3;
  CType CVar4;
  LogMessage *pLVar5;
  Descriptor *pDVar6;
  Descriptor *pDVar7;
  mapped_type *pmVar8;
  long *plVar9;
  EnumDescriptor *this_00;
  undefined8 *puVar10;
  undefined1 qualified;
  pointer pbVar11;
  FieldDescriptor **ppFVar12;
  size_type *psVar13;
  long lVar14;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *pFVar15;
  size_t sVar16;
  int iVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  char *pcVar20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  package_parts;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ordered_fields;
  string local_208;
  undefined1 local_1e8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  long local_198;
  undefined8 uStack_190;
  FieldDescriptor **local_188;
  FieldDescriptor *local_180;
  FieldDescriptor *local_178;
  long lStack_170;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_168;
  string local_138;
  Options *local_118;
  key_type local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  MessageGenerator *local_e8;
  long local_e0;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  LogMessage local_a0;
  LogMessage local_68;
  
  if (this->table_driven_ == true) {
    anon_unknown_0::SortFieldsByNumber(&local_d8,this->descriptor_);
    io::Printer::Print(printer,"::google::protobuf::internal::AuxillaryParseTableField(),\n");
    if (*(int *)(this->descriptor_ + 0x2c) < 1) {
      sVar16 = 1;
    }
    else {
      local_118 = &this->options_;
      local_f0 = &this->classname_;
      iVar17 = 1;
      lVar14 = 0;
      local_e8 = this;
      do {
        descriptor = local_d8.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar14];
        local_e0 = lVar14;
        if (*(int *)(descriptor + 0x38) < iVar17) {
          internal::LogMessage::LogMessage
                    (&local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0x7ae);
          pLVar5 = internal::LogMessage::operator<<
                             (&local_68,"CHECK failed: (field->number()) >= (last_field_number): ");
          internal::LogFinisher::operator=((LogFinisher *)&local_168,pLVar5);
          internal::LogMessage::~LogMessage(&local_68);
        }
        if (iVar17 < *(int *)(descriptor + 0x38)) {
          do {
            io::Printer::Print(printer,"::google::protobuf::internal::AuxillaryParseTableField(),\n"
                              );
            iVar17 = iVar17 + 1;
          } while (iVar17 < *(int *)(descriptor + 0x38));
        }
        local_168._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_168._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_168._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_168._M_impl.super__Rb_tree_header._M_header;
        local_168._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_168._M_impl.super__Rb_tree_header._M_header._M_right =
             local_168._M_impl.super__Rb_tree_header._M_header._M_left;
        SetCommonFieldVariables
                  (descriptor,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_168,local_118);
        TVar3 = FieldDescriptor::type(descriptor);
        qualified = 0x50;
        iVar1 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar3 * 4);
        if (iVar1 == 8) {
          this_00 = FieldDescriptor::enum_type(descriptor);
          ClassName_abi_cxx11_(&local_208,(cpp *)this_00,(EnumDescriptor *)0x1,(bool)qualified);
          local_1e8._0_8_ = local_1e8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"type","");
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&local_168,(key_type *)local_1e8);
          std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_208);
          if ((pointer)local_1e8._0_8_ != (pointer)(local_1e8 + 0x10)) {
            operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
          }
          io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)&local_168,
                             "{::google::protobuf::internal::AuxillaryParseTableField::enum_aux{$type$_IsValid, \"$type$\" }},\n"
                            );
LAB_0025e30e:
          iVar17 = iVar17 + 1;
        }
        else {
          if (iVar1 == 9) {
            CVar4 = EffectiveStringCType(descriptor);
            if (CVar4 - FieldOptions_CType_CORD < 2) {
              CEscape((string *)&local_1c8,*(string **)(descriptor + 0xa0));
              plVar9 = (long *)std::__cxx11::string::replace
                                         ((ulong)&local_1c8,0,(char *)0x0,0x356813);
              local_1e8._0_8_ = local_1e8 + 0x10;
              pbVar11 = (pointer)(plVar9 + 2);
              if ((pointer)*plVar9 == pbVar11) {
                local_1e8._16_8_ = (pbVar11->_M_dataplus)._M_p;
                local_1e8._24_8_ = plVar9[3];
              }
              else {
                local_1e8._16_8_ = (pbVar11->_M_dataplus)._M_p;
                local_1e8._0_8_ = (pointer)*plVar9;
              }
              local_1e8._8_8_ = plVar9[1];
              *plVar9 = (long)pbVar11;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              plVar9 = (long *)std::__cxx11::string::append(local_1e8);
              local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
              psVar13 = (size_type *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar13) {
                local_208.field_2._M_allocated_capacity = *psVar13;
                local_208.field_2._8_8_ = plVar9[3];
              }
              else {
                local_208.field_2._M_allocated_capacity = *psVar13;
                local_208._M_dataplus._M_p = (pointer)*plVar9;
              }
              local_208._M_string_length = plVar9[1];
              *plVar9 = (long)psVar13;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"default","");
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&local_168,&local_110);
              std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_208);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p != &local_110.field_2) {
                operator_delete(local_110._M_dataplus._M_p,
                                local_110.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_208._M_dataplus._M_p != &local_208.field_2) {
                operator_delete(local_208._M_dataplus._M_p,
                                local_208.field_2._M_allocated_capacity + 1);
              }
              if ((pointer)local_1e8._0_8_ != (pointer)(local_1e8 + 0x10)) {
                operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
              }
              uVar18 = local_1b8._M_allocated_capacity;
              uVar19 = local_1c8._M_allocated_capacity;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c8._M_allocated_capacity != &local_1b8) {
LAB_0025e1a9:
                operator_delete((void *)uVar19,
                                (ulong)((long)&(((pointer)uVar18)->_M_dataplus)._M_p + 1));
              }
            }
            else {
              if (CVar4 != FieldOptions_CType_STRING) goto LAB_0025e1b1;
              lVar14 = *(long *)(*(long *)(descriptor + 0xa0) + 8);
              if (lVar14 == 0) {
                local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_208,
                           "&::google::protobuf::internal::fixed_address_empty_string","");
              }
              else {
                std::operator+(&local_c0,"&",local_f0);
                plVar9 = (long *)std::__cxx11::string::append((char *)&local_c0);
                local_188 = &local_178;
                ppFVar12 = (FieldDescriptor **)(plVar9 + 2);
                if ((FieldDescriptor **)*plVar9 == ppFVar12) {
                  local_178 = *ppFVar12;
                  lStack_170 = plVar9[3];
                }
                else {
                  local_178 = *ppFVar12;
                  local_188 = (FieldDescriptor **)*plVar9;
                }
                local_180 = (FieldDescriptor *)plVar9[1];
                *plVar9 = (long)ppFVar12;
                plVar9[1] = 0;
                *(undefined1 *)(plVar9 + 2) = 0;
                FieldName_abi_cxx11_(&local_138,(cpp *)descriptor,local_180);
                pFVar15 = (FieldDescriptor *)0xf;
                if (local_188 != &local_178) {
                  pFVar15 = local_178;
                }
                if (pFVar15 < local_180 + local_138._M_string_length) {
                  uVar18 = (FieldDescriptor *)0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_138._M_dataplus._M_p != &local_138.field_2) {
                    uVar18 = local_138.field_2._M_allocated_capacity;
                  }
                  if ((ulong)uVar18 < local_180 + local_138._M_string_length) goto LAB_0025dfe1;
                  puVar10 = (undefined8 *)
                            std::__cxx11::string::replace
                                      ((ulong)&local_138,0,(char *)0x0,(ulong)local_188);
                }
                else {
LAB_0025dfe1:
                  puVar10 = (undefined8 *)
                            std::__cxx11::string::_M_append
                                      ((char *)&local_188,(ulong)local_138._M_dataplus._M_p);
                }
                local_1a8._M_allocated_capacity = (size_type)&local_198;
                plVar9 = puVar10 + 2;
                if ((long *)*puVar10 == plVar9) {
                  local_198 = *plVar9;
                  uStack_190 = puVar10[3];
                }
                else {
                  local_198 = *plVar9;
                  local_1a8._M_allocated_capacity = (size_type)(long *)*puVar10;
                }
                local_1a8._8_8_ = puVar10[1];
                *puVar10 = plVar9;
                puVar10[1] = 0;
                *(undefined1 *)plVar9 = 0;
                plVar9 = (long *)std::__cxx11::string::append(local_1a8._M_local_buf);
                local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
                psVar13 = (size_type *)(plVar9 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar9 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar13) {
                  local_208.field_2._M_allocated_capacity = *psVar13;
                  local_208.field_2._8_8_ = plVar9[3];
                }
                else {
                  local_208.field_2._M_allocated_capacity = *psVar13;
                  local_208._M_dataplus._M_p = (pointer)*plVar9;
                }
                local_208._M_string_length = plVar9[1];
                *plVar9 = (long)psVar13;
                plVar9[1] = 0;
                *(undefined1 *)(plVar9 + 2) = 0;
              }
              local_1e8._0_8_ = local_1e8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"default","");
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&local_168,(key_type *)local_1e8);
              std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_208);
              if ((pointer)local_1e8._0_8_ != (pointer)(local_1e8 + 0x10)) {
                operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_208._M_dataplus._M_p != &local_208.field_2) {
                operator_delete(local_208._M_dataplus._M_p,
                                local_208.field_2._M_allocated_capacity + 1);
              }
              if (lVar14 != 0) {
                if ((long *)local_1a8._M_allocated_capacity != &local_198) {
                  operator_delete((void *)local_1a8._M_allocated_capacity,local_198 + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_138._M_dataplus._M_p != &local_138.field_2) {
                  operator_delete(local_138._M_dataplus._M_p,
                                  (ulong)(local_138.field_2._M_allocated_capacity + 1));
                }
                if (local_188 != &local_178) {
                  operator_delete(local_188,(ulong)(local_178 + 1));
                }
                uVar18 = local_c0.field_2._M_allocated_capacity;
                uVar19 = local_c0._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c0._M_dataplus._M_p != &local_c0.field_2) goto LAB_0025e1a9;
              }
            }
LAB_0025e1b1:
            local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"full_name","");
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&local_168,&local_208);
            std::__cxx11::string::_M_assign((string *)pmVar8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p != &local_208.field_2) {
              operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1
                             );
            }
            pcVar20 = "false";
            if (*(int *)(*(long *)(descriptor + 0x30) + 0x8c) == 3) {
              pcVar20 = "true";
            }
            local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"strict","");
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&local_168,&local_208);
            std::__cxx11::string::_M_replace
                      ((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,(ulong)pcVar20);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p != &local_208.field_2) {
              operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1
                             );
            }
            local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"type","");
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&local_168,&local_208);
            std::__cxx11::string::_M_assign((string *)pmVar8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p != &local_208.field_2) {
              operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1
                             );
            }
            io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        *)&local_168,
                               "{::google::protobuf::internal::AuxillaryParseTableField::string_aux{\n  $default$,\n  \"$full_name$\",\n  $strict$,\n  \"$type$\"\n}},\n"
                              );
            goto LAB_0025e30e;
          }
          if (iVar1 == 10) {
            local_1c8._M_allocated_capacity = 0;
            local_1c8._8_8_ = 0;
            local_1b8._M_allocated_capacity = 0;
            pDVar6 = FieldDescriptor::message_type(descriptor);
            do {
              pDVar7 = pDVar6;
              pDVar6 = *(Descriptor **)(pDVar7 + 0x18);
            } while (*(Descriptor **)(pDVar7 + 0x18) != (Descriptor *)0x0);
            local_1e8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_1e8._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_1e8._16_8_ = (pointer)0x0;
            SplitStringUsing(*(string **)(pDVar7 + 8),".",
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_1e8);
            local_208.field_2._M_allocated_capacity = local_1b8._M_allocated_capacity;
            local_208._M_string_length = local_1c8._8_8_;
            local_208._M_dataplus._M_p = (pointer)local_1c8._M_allocated_capacity;
            pbVar11 = (pointer)local_1e8._16_8_;
            local_1c8._M_allocated_capacity = local_1e8._0_8_;
            local_1c8._8_8_ = local_1e8._8_8_;
            local_1b8._M_allocated_capacity = local_1e8._16_8_;
            local_1e8._0_8_ = (pointer)0x0;
            local_1e8._8_8_ = (pointer)0x0;
            local_1e8._16_8_ = (pointer)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_208);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1e8);
            if (local_1c8._8_8_ == local_1c8._M_allocated_capacity) {
              pbVar11 = (pointer)0x7cb;
              internal::LogMessage::LogMessage
                        (&local_a0,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                         ,0x7cb);
              pLVar5 = internal::LogMessage::operator<<
                                 (&local_a0,"CHECK failed: (package_parts.size()) != (0): ");
              internal::LogFinisher::operator=((LogFinisher *)&local_208,pLVar5);
              internal::LogMessage::~LogMessage(&local_a0);
            }
            *(undefined8 *)(local_1c8._8_8_ + -0x18) = 0;
            **(undefined1 **)(local_1c8._8_8_ + -0x20) = 0;
            pDVar6 = FieldDescriptor::message_type(descriptor);
            ClassName_abi_cxx11_(&local_208,(cpp *)pDVar6,(Descriptor *)0x0,SUB81(pbVar11,0));
            local_1e8._0_8_ = local_1e8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"classname","");
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&local_168,(key_type *)local_1e8);
            std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_208);
            if ((pointer)local_1e8._0_8_ != (pointer)(local_1e8 + 0x10)) {
              operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p != &local_208.field_2) {
              operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1
                             );
            }
            Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      (&local_208,(protobuf *)local_1c8._M_local_buf,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)0x380f0c,(char *)pbVar11);
            local_1e8._0_8_ = local_1e8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"ns","");
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&local_168,(key_type *)local_1e8);
            std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_208);
            pFVar15 = extraout_RDX;
            if ((pointer)local_1e8._0_8_ != (pointer)(local_1e8 + 0x10)) {
              operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
              pFVar15 = extraout_RDX_00;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p != &local_208.field_2) {
              operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1
                             );
              pFVar15 = extraout_RDX_01;
            }
            FieldMessageTypeName_abi_cxx11_(&local_208,(cpp *)descriptor,pFVar15);
            local_1e8._0_8_ = local_1e8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"type","");
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&local_168,(key_type *)local_1e8);
            std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_208);
            if ((pointer)local_1e8._0_8_ != (pointer)(local_1e8 + 0x10)) {
              operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p != &local_208.field_2) {
              operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1
                             );
            }
            FileLevelNamespace(&local_208,(string *)**(undefined8 **)(pDVar7 + 0x10));
            local_1e8._0_8_ = local_1e8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"file_namespace","")
            ;
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&local_168,(key_type *)local_1e8);
            std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_208);
            if ((pointer)local_1e8._0_8_ != (pointer)(local_1e8 + 0x10)) {
              operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p != &local_208.field_2) {
              operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1
                             );
            }
            io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        *)&local_168,
                               "{::google::protobuf::internal::AuxillaryParseTableField::message_aux{\n  &::$ns$_$classname$_default_instance_,\n"
                              );
            pDVar6 = FieldDescriptor::message_type(descriptor);
            bVar2 = anon_unknown_0::TableDrivenEnabled(pDVar6,local_118);
            if (bVar2) {
              io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          *)&local_168,
                                 "  ::$ns$$file_namespace$::TableStruct::schema +\n    ::$ns$$classname$::kIndexInFileMessages,\n"
                                );
            }
            else {
              io::Printer::Print(printer,"  NULL,\n");
            }
            io::Printer::Print(printer,"}},\n");
            iVar17 = iVar17 + 1;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_1c8);
          }
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_168);
        lVar14 = local_e0 + 1;
      } while (lVar14 < *(int *)(local_e8->descriptor_ + 0x2c));
      sVar16 = (size_t)iVar17;
    }
    if (local_d8.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d8.
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_d8.
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    sVar16 = 0;
  }
  return sVar16;
}

Assistant:

size_t MessageGenerator::GenerateParseAuxTable(io::Printer* printer) {
  if (!table_driven_) {
    return 0;
  }

  std::vector<const FieldDescriptor*> ordered_fields =
      SortFieldsByNumber(descriptor_);

  printer->Print("::google::protobuf::internal::AuxillaryParseTableField(),\n");
  int last_field_number = 1;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = ordered_fields[i];

    GOOGLE_CHECK_GE(field->number(), last_field_number);
    for (; last_field_number < field->number(); last_field_number++) {
      printer->Print("::google::protobuf::internal::AuxillaryParseTableField(),\n");
    }

    std::map<string, string> vars;
    SetCommonFieldVariables(field, &vars, options_);

    switch (field->cpp_type()) {
      case FieldDescriptor::CPPTYPE_ENUM:
        vars["type"] = ClassName(field->enum_type(), true);
        printer->Print(
            vars,
            "{::google::protobuf::internal::AuxillaryParseTableField::enum_aux{"
            "$type$_IsValid, \"$type$\" }},\n");
        last_field_number++;
        break;
      case FieldDescriptor::CPPTYPE_MESSAGE: {
        std::vector<string> package_parts;

        const Descriptor* outer = field->message_type();
        while (outer->containing_type() != NULL) {
          outer = outer->containing_type();
        }

        package_parts = Split(
            outer->full_name(), ".", true);
        // outer->full_name() contains the class itself.  Remove it as it is
        // used in the name of the default instance variable.
        GOOGLE_DCHECK_NE(package_parts.size(), 0);
        package_parts.back().clear();

        vars["classname"] = ClassName(field->message_type(), false);
        vars["ns"] = Join(package_parts, "::");
        vars["type"] = FieldMessageTypeName(field);
        vars["file_namespace"] = FileLevelNamespace(outer->file()->name());

        printer->Print(vars,
            "{::google::protobuf::internal::AuxillaryParseTableField::message_aux{\n"
            "  &::$ns$_$classname$_default_instance_,\n");

        bool dont_emit_table =
            !TableDrivenEnabled(field->message_type(), options_);

        if (dont_emit_table) {
          printer->Print("  NULL,\n");
        } else {
          printer->Print(vars,
              "  ::$ns$$file_namespace$::TableStruct::schema +\n"
              "    ::$ns$$classname$::kIndexInFileMessages,\n");
        }

        printer->Print("}},\n");
        last_field_number++;
        break;
      }
      case FieldDescriptor::CPPTYPE_STRING:
        switch (EffectiveStringCType(field)) {
          case FieldOptions::STRING:
            vars["default"] =
                field->default_value_string().empty()
                  ? "&::google::protobuf::internal::fixed_address_empty_string"
                  : "&" + classname_ + "::_default_" + FieldName(field) + "_";
            break;
          case FieldOptions::CORD:
          case FieldOptions::STRING_PIECE:
            vars["default"] =
                "\"" + CEscape(field->default_value_string()) + "\"";
            break;
        }
        vars["full_name"] = field->full_name();
        vars["strict"] =
          field->file()->syntax() == FileDescriptor::SYNTAX_PROTO3
          ? "true" : "false";
        vars["type"] = field->full_name();
        printer->Print(vars,
            "{::google::protobuf::internal::AuxillaryParseTableField::string_aux{\n"
            "  $default$,\n"
            "  \"$full_name$\",\n"
            "  $strict$,\n"
            "  \"$type$\"\n"
            "}},\n");
        last_field_number++;
        break;
      default:
        break;
    }
  }

  return last_field_number;
}